

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrLocateSpace
                   (XrSpace space,XrSpace baseSpace,XrTime time,XrSpaceLocation *location)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  XrResult XVar3;
  ostream *poVar4;
  GenValidUsageXrInstanceInfo *instance_info;
  XrResult XVar5;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var6;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar7;
  XrSpace_T *in_stack_fffffffffffffd58;
  allocator local_29a;
  allocator local_299;
  string local_298;
  XrSpace baseSpace_local;
  XrSpace space_local;
  string local_268;
  string local_248;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 4;
  baseSpace_local = baseSpace;
  space_local = space;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpace_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&space_local,(XrObjectType *)&oss);
  VVar2 = VerifyXrSpaceHandle(&space_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar7 = HandleInfo<XrSpace_T_*>::getWithInstanceInfo(&g_space_info,space_local);
    instance_info = pVar7.second;
    _oss = 4;
    std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
    emplace_back<XrSpace_T*&,XrObjectType>
              ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
               &objects_info,&baseSpace_local,(XrObjectType *)&oss);
    VVar2 = VerifyXrSpaceHandle(&baseSpace_local);
    if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
      bVar1 = VerifyXrParent(XR_OBJECT_TYPE_SPACE,(uint64_t)space_local,XR_OBJECT_TYPE_SPACE,
                             (uint64_t)baseSpace_local,false);
      if (bVar1) {
        if (location == (XrSpaceLocation *)0x0) {
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrLocateSpace-location-parameter",(allocator *)&local_248)
          ;
          std::__cxx11::string::string((string *)&local_298,"xrLocateSpace",&local_299);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_1f0,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_268,
                     "Invalid NULL for XrSpaceLocation \"location\" which is not optional and must be non-NULL"
                     ,&local_29a);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_298,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_1f0,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          p_Var6 = &local_1f0;
        }
        else {
          std::__cxx11::string::string((string *)&oss,"xrLocateSpace",(allocator *)&local_298);
          XVar5 = XR_SUCCESS;
          XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,location);
          std::__cxx11::string::~string((string *)&oss);
          if (XVar3 == XR_SUCCESS) goto LAB_001c1fcf;
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrLocateSpace-location-parameter",(allocator *)&local_248)
          ;
          std::__cxx11::string::string((string *)&local_298,"xrLocateSpace",&local_299);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_208,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_268,"Command xrLocateSpace param location is invalid",
                     &local_29a);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_298,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_208,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          p_Var6 = &local_208;
        }
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(p_Var6);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&oss);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar4 = std::operator<<((ostream *)&oss,"XrSpace ");
        HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd58);
        std::operator<<(poVar4,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::operator<<((ostream *)&oss," and XrSpace ");
        HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd58);
        std::operator<<((ostream *)&oss,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::operator<<((ostream *)&oss," must share a parent");
        std::__cxx11::string::string
                  ((string *)&local_298,"VUID-xrLocateSpace-commonparent",&local_299);
        std::__cxx11::string::string((string *)&local_268,"xrLocateSpace",&local_29a);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1d8,&objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_298,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_268,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_1d8,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1d8);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      }
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
      goto LAB_001c1fcf;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSpace handle \"baseSpace\" ");
    HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd58);
    std::operator<<((ostream *)&oss,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string
              ((string *)&local_298,"VUID-xrLocateSpace-baseSpace-parameter",&local_299);
    std::__cxx11::string::string((string *)&local_268,"xrLocateSpace",&local_29a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_298,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_268,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    p_Var6 = &local_1c0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSpace handle \"space\" ");
    HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffd58);
    std::operator<<((ostream *)&oss,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string
              ((string *)&local_298,"VUID-xrLocateSpace-space-parameter",&local_299);
    std::__cxx11::string::string((string *)&local_268,"xrLocateSpace",&local_29a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1a8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_298,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_268,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1a8,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    p_Var6 = &local_1a8;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var6);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  XVar5 = XR_ERROR_HANDLE_INVALID;
LAB_001c1fcf:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar5;
}

Assistant:

XrResult GenValidUsageInputsXrLocateSpace(
XrSpace space,
XrSpace baseSpace,
XrTime time,
XrSpaceLocation* location) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(space, XR_OBJECT_TYPE_SPACE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&space);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"space\" ";
                oss << HandleToHexString(space);
                CoreValidLogMessage(nullptr, "VUID-xrLocateSpace-space-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_space_info.getWithInstanceInfo(space);
        GenValidUsageXrHandleInfo *gen_space_info = info_with_instance.first;
        (void)gen_space_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        objects_info.emplace_back(baseSpace, XR_OBJECT_TYPE_SPACE);
        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&baseSpace);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"baseSpace\" ";
                oss << HandleToHexString(baseSpace);
                CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-baseSpace-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        // Verify that the handles share a common ancestry
        if (!VerifyXrParent(XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(space),
                    XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(baseSpace), false)) {
            std::ostringstream oss_error;
            oss_error << "XrSpace " << HandleToHexString(space);
            oss_error <<  " and XrSpace ";
            oss_error << HandleToHexString(baseSpace);
            oss_error <<  " must share a parent";
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-commonparent",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                objects_info, oss_error.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == location) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-location-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace", objects_info,
                                "Invalid NULL for XrSpaceLocation \"location\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSpaceLocation is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateSpace", objects_info,
                                                        false, true, location);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSpace-location-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSpace",
                                objects_info,
                                "Command xrLocateSpace param location is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}